

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-bson.c
# Opt level: O3

int lbinary(lua_State *L)

{
  ulong uVar1;
  luaL_Buffer b;
  luaL_Buffer local_2030;
  
  lua_settop(L,1);
  luaL_buffinit(L,&local_2030);
  if (local_2030.size <= local_2030.n) {
    luaL_prepbuffsize(&local_2030,1);
  }
  uVar1 = local_2030.n + 1;
  local_2030.b[local_2030.n] = '\0';
  if (local_2030.size <= uVar1) {
    local_2030.n = uVar1;
    luaL_prepbuffsize(&local_2030,1);
    uVar1 = local_2030.n;
  }
  local_2030.n = uVar1 + 1;
  local_2030.b[uVar1] = '\x05';
  if (local_2030.size <= local_2030.n) {
    luaL_prepbuffsize(&local_2030,1);
  }
  local_2030.b[local_2030.n] = '\0';
  local_2030.n = local_2030.n + 1;
  luaL_addvalue(&local_2030);
  luaL_pushresult(&local_2030);
  return 1;
}

Assistant:

static int
lbinary(lua_State *L) {
	lua_settop(L,1);
	luaL_Buffer b;
	luaL_buffinit(L, &b);
	luaL_addchar(&b, 0);
	luaL_addchar(&b, BSON_BINARY);
	luaL_addchar(&b, 0);	// sub type
	luaL_addvalue(&b);
	luaL_pushresult(&b);

	return 1;
}